

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

EnumVal * __thiscall
flatbuffers::EnumValBuilder::CreateEnumerator(EnumValBuilder *this,string *ev_name)

{
  bool bVar1;
  EnumVal *this_00;
  reference ppEVar2;
  int64_t local_50;
  bool first;
  string *ev_name_local;
  EnumValBuilder *this_local;
  
  if (this->temp != (EnumVal *)0x0) {
    __assert_fail("!temp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x951,
                  "EnumVal *flatbuffers::EnumValBuilder::CreateEnumerator(const std::string &)");
  }
  bVar1 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::empty
                    (&(this->enum_def->vals).vec);
  this->user_value = bVar1;
  this_00 = (EnumVal *)operator_new(0xa8);
  if (bVar1) {
    local_50 = 0;
  }
  else {
    ppEVar2 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::back
                        (&(this->enum_def->vals).vec);
    local_50 = (*ppEVar2)->value;
  }
  EnumVal::EnumVal(this_00,ev_name,local_50);
  this->temp = this_00;
  return this->temp;
}

Assistant:

EnumVal *CreateEnumerator(const std::string &ev_name) {
    FLATBUFFERS_ASSERT(!temp);
    auto first = enum_def.vals.vec.empty();
    user_value = first;
    temp = new EnumVal(ev_name, first ? 0 : enum_def.vals.vec.back()->value);
    return temp;
  }